

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O0

void __thiscall
slang::syntax::SyntaxRewriter<InterleavedRewriter>::~SyntaxRewriter
          (SyntaxRewriter<InterleavedRewriter> *this)

{
  ChangeCollection *in_RDI;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *unaff_retaddr;
  
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::~vector(unaff_retaddr);
  detail::ChangeCollection::~ChangeCollection(in_RDI);
  BumpAllocator::~BumpAllocator((BumpAllocator *)in_RDI);
  return;
}

Assistant:

SyntaxRewriter() : factory(alloc) {}